

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::Image::ImageTests::addCreateAndroidNative(ImageTests *this,string *name,GLenum format)

{
  ImageSource *pIVar1;
  Action *pAVar2;
  MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  local_40;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_30;
  
  pAVar2 = (Action *)operator_new(0x18);
  createAndroidNativeImageSource(&local_40,format);
  pIVar1 = local_40.
           super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           .m_data.ptr;
  pAVar2->_vptr_Action = (_func_int **)&PTR__Create_02166ff0;
  local_40.
  super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  .m_data.ptr = (ImageSource *)0x0;
  pAVar2[1]._vptr_Action = (_func_int **)pIVar1;
  local_30.super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
  .m_data.ptr = pAVar2;
  LabeledActions::add(&this->m_createActions,name,&local_30);
  if (local_30.
      super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>.
      m_data.ptr != (Action *)0x0) {
    (*(local_30.
       super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>.
       m_data.ptr)->_vptr_Action[1])();
    local_30.
    super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>.m_data
    .ptr = (Action *)0x0;
  }
  if (local_40.
      super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
      .m_data.ptr != (ImageSource *)0x0) {
    (*(local_40.
       super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
       .m_data.ptr)->_vptr_ImageSource[1])();
  }
  return;
}

Assistant:

void ImageTests::addCreateAndroidNative (const string& name, GLenum format)
{
	m_createActions.add(name, MovePtr<Action>(new GLES2ImageApi::Create(createAndroidNativeImageSource(format))));
}